

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O0

void SetupChainParamsBaseOptions(ArgsManager *argsman)

{
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  allocator<char> *in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffcc0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  OptionsCategory *in_stack_fffffffffffffcf8;
  allocator<char> *cat;
  undefined8 in_stack_fffffffffffffd00;
  uint uVar2;
  ArgsManager *pAVar1;
  string *in_stack_fffffffffffffd08;
  string *help;
  string *in_stack_fffffffffffffd10;
  string *name;
  ArgsManager *in_stack_fffffffffffffd18;
  ArgsManager *this_00;
  allocator<char> local_28a;
  allocator<char> local_289;
  undefined4 local_288;
  allocator<char> local_282;
  allocator<char> local_281;
  undefined4 local_280;
  allocator<char> local_27a;
  allocator<char> local_279;
  undefined4 local_278;
  undefined1 local_272 [2];
  undefined4 local_270;
  allocator<char> local_26a;
  allocator<char> local_269;
  undefined4 local_268;
  allocator<char> local_262;
  undefined1 local_261 [7];
  undefined1 local_25a [8];
  allocator<char> local_252;
  allocator<char> local_251 [7];
  allocator<char> local_24a;
  allocator<char> local_249 [577];
  long local_8;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_251[1] = (allocator<char>)0x6;
  local_251[2] = (allocator<char>)0x0;
  local_251[3] = (allocator<char>)0x0;
  local_251[4] = (allocator<char>)0x0;
  ArgsManager::AddArg(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                      uVar2,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_24a);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_25a._2_4_ = 6;
  ArgsManager::AddArg(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                      uVar2,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_252);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(local_251);
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  name = (string *)local_25a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_261._1_4_ = 5;
  ArgsManager::AddArg(this_00,name,in_stack_fffffffffffffd08,uVar2,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator((allocator<char> *)local_25a);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator((allocator<char> *)(local_25a + 1));
  help = (string *)local_261;
  pAVar1 = in_RDI;
  std::allocator<char>::allocator();
  uVar2 = (uint)((ulong)pAVar1 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  cat = &local_262;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_268 = 6;
  ArgsManager::AddArg(this_00,name,help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_262);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator((allocator<char> *)local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_270 = 6;
  ArgsManager::AddArg(this_00,name,help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_26a);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_272;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_278 = 6;
  ArgsManager::AddArg(this_00,name,help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator((allocator<char> *)local_272);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator((allocator<char> *)(local_272 + 1));
  __s = &local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
  local_280 = 6;
  ArgsManager::AddArg(this_00,name,help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_27a);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
  local_288 = 6;
  ArgsManager::AddArg(this_00,name,help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_282);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
  ArgsManager::AddArg(this_00,name,help,uVar2,(OptionsCategory *)cat);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_28a);
  std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(&local_289);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetupChainParamsBaseOptions(ArgsManager& argsman)
{
    argsman.AddArg("-chain=<chain>", "Use the chain <chain> (default: main). Allowed values: " LIST_CHAIN_NAMES, ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-regtest", "Enter regression test mode, which uses a special chain in which blocks can be solved instantly. "
                 "This is intended for regression testing tools and app development. Equivalent to -chain=regtest.", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-testactivationheight=name@height.", "Set the activation height of 'name' (segwit, bip34, dersig, cltv, csv). (regtest-only)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-testnet", "Use the testnet3 chain. Equivalent to -chain=test. Support for testnet3 is deprecated and will be removed in an upcoming release. Consider moving to testnet4 now by using -testnet4.", ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-testnet4", "Use the testnet4 chain. Equivalent to -chain=testnet4.", ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-vbparams=deployment:start:end[:min_activation_height]", "Use given start/end times and min_activation_height for specified version bits deployment (regtest-only)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-signet", "Use the signet chain. Equivalent to -chain=signet. Note that the network is defined by the -signetchallenge parameter", ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-signetchallenge", "Blocks must satisfy the given script to be considered valid (only for signet networks; defaults to the global default signet test network challenge)", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_NEGATION, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-signetseednode", "Specify a seed node for the signet network, in the hostname[:port] format, e.g. sig.net:1234 (may be used multiple times to specify multiple seed nodes; defaults to the global default signet test network seed node(s))", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_NEGATION, OptionsCategory::CHAINPARAMS);
}